

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcFlowMovingDeviceType::~IfcFlowMovingDeviceType
          (IfcFlowMovingDeviceType *this)

{
  void *pvVar1;
  long lVar2;
  
  lVar2 = *(long *)(*(long *)&(this->super_IfcDistributionFlowElementType).
                              super_IfcDistributionElementType.super_IfcElementType.
                              super_IfcTypeProduct.super_IfcTypeObject + -0x18);
  pvVar1 = &(this->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.
            super_IfcElementType.field_0x168 + lVar2;
  *(undefined8 *)((long)pvVar1 + -0x168) = 0x870ca8;
  *(undefined8 *)((long)pvVar1 + 0x48) = 0x870d70;
  *(undefined8 *)((long)pvVar1 + -0xe0) = 0x870cd0;
  *(undefined8 *)((long)pvVar1 + -0xd0) = 0x870cf8;
  *(undefined8 *)((long)pvVar1 + -0x78) = 0x870d20;
  *(undefined8 *)((long)pvVar1 + -0x20) = 0x870d48;
  if (*(void **)((long)pvVar1 + -0x10) != pvVar1) {
    operator_delete(*(void **)((long)pvVar1 + -0x10));
  }
  IfcTypeProduct::~IfcTypeProduct
            ((IfcTypeProduct *)
             (&(this->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.
               super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0x0 + lVar2),
             &PTR_construction_vtable_24__00870878);
  return;
}

Assistant:

IfcFlowMovingDeviceType() : Object("IfcFlowMovingDeviceType") {}